

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifnfy(bifcxdef *ctx,int argc)

{
  objnum func;
  prpnum prop;
  uint uVar1;
  runcxdef *prVar2;
  runsdef *prVar3;
  voccxdef *ctx_00;
  uint tm;
  
  prVar2 = ctx->bifcxrun;
  prVar3 = prVar2->runcxsp;
  ctx_00 = prVar2->runcxvoc;
  prVar2->runcxsp = prVar3 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar3[-1].runstyp != '\x02') {
    prVar2->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar3 = prVar2->runcxsp;
  func = (prVar3->runsv).runsvobj;
  prVar2->runcxsp = prVar3 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar3[-1].runstyp == '\r') {
    prVar3 = prVar2->runcxsp;
    prop = (prVar3->runsv).runsvprp;
    prVar2->runcxsp = prVar3 + -1;
    if (prVar3[-1].runstyp == '\x01') {
      uVar1 = *(uint *)&ctx->bifcxrun->runcxsp->runsv;
      tm = 0xffff;
      if (uVar1 != 0) {
        tm = uVar1;
      }
      vocsetfd(ctx_00,ctx_00->voccxalm,func,prop,tm,(runsdef *)0x0,0x407);
      return;
    }
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  prVar2->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f4);
}

Assistant:

void bifnfy(bifcxdef *ctx, int argc)
{
    objnum    objn;
    prpnum    prp;
    uint      tm;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 3, argc);            /* check for proper argument count */
    objn = runpopobj(ctx->bifcxrun);
    prp = runpopprp(ctx->bifcxrun);
    tm = runpopnum(ctx->bifcxrun);

    /* a time of zero means every turn */
    if (tm == 0)
        tm = VOCDTIM_EACH_TURN;
    
    vocsetfd(voc, voc->voccxalm, objn, prp, tm,
             (runsdef *)0, ERR_MANYNFY);
}